

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O2

unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> __thiscall
ApprovalTests::ReporterFactory::createReporter(ReporterFactory *this,string *reporterName)

{
  string *in_RDX;
  string key;
  string osPrefix;
  string local_60;
  string local_40;
  
  getOsPrefix_abi_cxx11_();
  findReporterName(&local_60,(ReporterFactory *)reporterName,&local_40,in_RDX);
  if (local_60._M_string_length == 0) {
    *(undefined8 *)&(this->map)._M_t._M_impl = 0;
  }
  else {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
          *)reporterName,&local_60);
    ::std::
    function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>
    ::operator()((function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>
                  *)this);
  }
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  return (__uniq_ptr_data<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>,_true,_true>
          )(__uniq_ptr_data<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Reporter>
    ReporterFactory::createReporter(const std::string& reporterName) const
    {
        auto osPrefix = getOsPrefix();

        auto key = findReporterName(osPrefix, reporterName);

        if (!key.empty())
        {
            return map.at(key)();
        }

        return std::unique_ptr<Reporter>();
    }